

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test::testBody
          (TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *test;
  undefined4 extraout_var;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  undefined1 local_158 [8];
  MockUnexpectedOutputParameterFailure expectedFailure;
  SimpleString local_e0;
  undefined1 local_d0 [8];
  MockNamedValue parameter;
  undefined1 local_70 [8];
  MockExpectedCallsListForTest expectations;
  SimpleString local_50;
  MyTypeForTestingCopier local_40;
  MyTypeForTestingCopier copier;
  undefined1 local_28 [8];
  MyTypeForTesting actualObject;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&actualObject.value + 7));
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_28,0x2282);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_40);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString
            ((SimpleString *)&expectations.super_MockExpectedCallsList.head_,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])
            (pMVar2,&expectations.super_MockExpectedCallsList.head_,&local_40);
  SimpleString::~SimpleString((SimpleString *)&expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_50);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_70);
  SimpleString::SimpleString((SimpleString *)&parameter.copier_,"foo");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)local_70,(SimpleString *)&parameter.copier_);
  SimpleString::~SimpleString((SimpleString *)&parameter.copier_);
  SimpleString::SimpleString(&local_e0,"parameterName");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_d0,&local_e0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "MyTypeForTesting");
  MockNamedValue::setConstObjectPointer
            ((MockNamedValue *)local_d0,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,local_28);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_168,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)local_158,test,&local_168,
             (MockNamedValue *)local_d0,(MockExpectedCallsList *)local_70);
  SimpleString::~SimpleString(&local_168);
  SimpleString::SimpleString(&local_178,"");
  pMVar2 = mock(&local_178,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_188,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_188);
  SimpleString::~SimpleString(&local_188);
  SimpleString::~SimpleString(&local_178);
  SimpleString::SimpleString(&local_198,"");
  pMVar2 = mock(&local_198,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1a8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_1a8);
  SimpleString::SimpleString(&local_1b8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_1c8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar1),&local_1b8,&local_1c8,local_28);
  SimpleString::~SimpleString(&local_1c8);
  SimpleString::~SimpleString(&local_1b8);
  SimpleString::~SimpleString(&local_1a8);
  SimpleString::~SimpleString(&local_198);
  SimpleString::SimpleString(&local_1d8,"");
  pMVar2 = mock(&local_1d8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_1d8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xd9);
  SimpleString::SimpleString(&local_1e8,"");
  pMVar2 = mock(&local_1e8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_1e8);
  MockUnexpectedOutputParameterFailure::~MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)local_158);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_d0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_70);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_40);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&actualObject.value + 7));
  return;
}

Assistant:

TEST(MockComparatorCopierTest, unexpectedCustomTypeOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting actualObject(8834);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo");
    MockNamedValue parameter("parameterName");
    parameter.setConstObjectPointer("MyTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo");
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}